

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

bool __thiscall
Inferences::InductionClauseIterator::isValidBound
          (InductionClauseIterator *this,InductionContext *context,Bound *bound)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  Term *t;
  Term *pTVar5;
  Literal **lit;
  _Hash_node_base *p_Var6;
  
  t = getPlaceholderForTerm(&context->_indTerms,0);
  p_Var1 = (context->_cls)._M_h._M_before_begin._M_nxt;
  do {
    bVar3 = p_Var1 == (_Hash_node_base *)0x0;
    if (bVar3) {
      return bVar3;
    }
    p_Var2 = p_Var1[4]._M_nxt;
    for (p_Var6 = p_Var1[3]._M_nxt; p_Var6 != p_Var2; p_Var6 = p_Var6 + 1) {
      pTVar5 = InductionHelper::getOtherTermFromComparison((Literal *)p_Var6->_M_nxt,t);
      if ((undefined1  [36])((undefined1  [36])bound->_inner & (undefined1  [36])0x1) ==
          (undefined1  [36])0x0) {
        bVar4 = pTVar5 != *(Term **)(bound->_inner)._content &&
                *(_Hash_node_base **)((bound->_inner)._content + 0x18) != p_Var1[1]._M_nxt;
      }
      else {
        bVar4 = pTVar5 != *(Term **)(bound->_inner)._content;
      }
      if (!bVar4) {
        return bVar3;
      }
    }
    p_Var1 = p_Var1->_M_nxt;
  } while( true );
}

Assistant:

bool InductionClauseIterator::isValidBound(const InductionContext& context, const Bound& bound)
{
  ASS_EQ(context._indTerms.size(), 1);
  Term* pt = getPlaceholderForTerm(context._indTerms,0);
  for (const auto& kv : context._cls) {
    for (const auto& lit : kv.second) {
      ASS((lit != nullptr) && (kv.first != nullptr));
      Term* otherArg = InductionHelper::getOtherTermFromComparison(lit, pt);
      if (!bound.match(
            [&](TermLiteralClause const&  bound) 
            { return InductionHelper::isValidBound(otherArg, kv.first, bound); },
            [&](DefaultBound const& bound) 
            { return InductionHelper::isValidForDefaultBound(otherArg, kv.first, bound.term); }
            )) {
        return false;
      }
    }
  }
  return true;
}